

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_heterogeneous_queue_basic_tests.cpp
# Opt level: O1

void density_tests::conc_heterogeneous_queue_lifetime_tests(void)

{
  ControlBlock *pCVar1;
  ControlBlock *pCVar2;
  bool bVar3;
  runtime_type<> *prVar4;
  int *piVar5;
  type other_queue;
  consume_operation cons;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  conc_heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator> move_only_queue
  ;
  int local_fc;
  __native_type local_f8;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> local_d0;
  consume_operation local_b8;
  __native_type local_98;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> local_70;
  consume_operation local_58;
  undefined8 local_38;
  heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator> local_30;
  
  local_98._16_8_ = 0;
  local_98.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_98.__align = 0;
  local_98._8_8_ = 0;
  local_98.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_70.m_head = (ControlBlock *)&DAT_0000ffef;
  local_70.m_tail = (ControlBlock *)&DAT_0000ffef;
  local_f8.__data.__lock = 1;
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                    *)&local_98.__data,(int *)local_f8.__size);
  local_f8.__data.__lock = 2;
  density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<int,int>((conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                    *)&local_98.__data,(int *)local_f8.__size);
  local_f8._16_8_ = 0;
  local_f8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_f8.__align = 0;
  local_f8._8_8_ = 0;
  local_f8.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_d0.m_head = local_70.m_head;
  local_d0.m_tail = local_70.m_tail;
  local_70.m_head = (ControlBlock *)&DAT_0000ffef;
  local_70.m_tail = (ControlBlock *)&DAT_0000ffef;
  bVar3 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&local_98.__data);
  if (bVar3) {
    bVar3 = density::
            conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_f8.__data);
    if (bVar3) goto LAB_00e23a76;
  }
  else {
LAB_00e23a76:
    detail::assert_failed<>
              ("queue.empty() && !other_queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x20);
  }
  pCVar2 = local_70.m_tail;
  pCVar1 = local_70.m_head;
  local_70.m_head = local_d0.m_head;
  local_70.m_tail = local_d0.m_tail;
  local_d0.m_head = pCVar1;
  local_d0.m_tail = pCVar2;
  bVar3 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&local_98.__data);
  if (bVar3) {
LAB_00e23abc:
    detail::assert_failed<>
              ("!queue.empty() && other_queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x24);
  }
  else {
    bVar3 = density::
            conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_f8.__data);
    if (!bVar3) goto LAB_00e23abc;
  }
  pCVar2 = local_70.m_tail;
  pCVar1 = local_70.m_head;
  local_70.m_head = local_d0.m_head;
  local_70.m_tail = local_d0.m_tail;
  local_d0.m_head = pCVar1;
  local_d0.m_tail = pCVar2;
  bVar3 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&local_98.__data);
  if (bVar3) {
    bVar3 = density::
            conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&local_f8.__data);
    if (bVar3) goto LAB_00e23b02;
  }
  else {
LAB_00e23b02:
    detail::assert_failed<>
              ("queue.empty() && !other_queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x26);
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume(&local_b8,
                    (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_f8.__data);
  if (local_b8.m_consume_operation.m_control == (ControlBlock *)0x0) {
LAB_00e23b59:
    detail::assert_failed<>
              ("cons && cons.complete_type().is<int>() && cons.element<int>() == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x28);
  }
  else {
    prVar4 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::complete_type(&local_b8.m_consume_operation);
    if (prVar4->m_feature_table !=
        (tuple_type *)
        density::detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
        ::s_table) goto LAB_00e23b59;
    piVar5 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::element<int>(&local_b8.m_consume_operation);
    if (*piVar5 != 1) goto LAB_00e23b59;
  }
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit(&local_b8);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume(&local_58,
                    (conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&local_f8.__data);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::operator=(&local_b8,&local_58);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation(&local_58);
  if (local_b8.m_consume_operation.m_control != (ControlBlock *)0x0) {
    prVar4 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::complete_type(&local_b8.m_consume_operation);
    if (prVar4->m_feature_table ==
        (tuple_type *)
        density::detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
        ::s_table) {
      piVar5 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::element<int>(&local_b8.m_consume_operation);
      if (*piVar5 == 2) goto LAB_00e23beb;
    }
  }
  detail::assert_failed<>
            ("cons && cons.complete_type().is<int>() && cons.element<int>() == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
             ,0x2b);
LAB_00e23beb:
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit(&local_b8);
  bVar3 = density::
          conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
          empty((conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                 *)&local_f8.__data);
  if (!bVar3) {
    detail::assert_failed<>
              ("other_queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/concurrent_heterogeneous_queue_basic_tests.cpp"
               ,0x2d);
  }
  local_58.m_consume_operation.m_queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)0x0;
  local_58.m_consume_operation.m_control = (ControlBlock *)0x0;
  local_58.m_lock._M_device = (mutex_type *)0x0;
  local_58.m_lock._M_owns = false;
  local_58.m_lock._9_7_ = 0;
  local_38 = 0;
  local_30.m_head = (ControlBlock *)&DAT_0000ffef;
  local_30.m_tail = (ControlBlock *)&DAT_0000ffef;
  local_fc = 1;
  density::conc_heter_queue<density::runtime_type<>,density_tests::move_only_void_allocator>::
  emplace<int,int>((conc_heter_queue<density::runtime_type<>,density_tests::move_only_void_allocator>
                    *)&local_58,&local_fc);
  local_fc = 2;
  density::conc_heter_queue<density::runtime_type<>,density_tests::move_only_void_allocator>::
  emplace<int,int>((conc_heter_queue<density::runtime_type<>,density_tests::move_only_void_allocator>
                    *)&local_58,&local_fc);
  density::heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator>::destroy
            (&local_30);
  density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation(&local_b8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_d0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::destroy
            (&local_70);
  return;
}

Assistant:

void conc_heterogeneous_queue_basic_void_tests()
    {
        {
            QUEUE queue;
            DENSITY_TEST_ASSERT(queue.empty());
        }

        {
            QUEUE queue;
            queue.clear();

            queue.push(1);
            DENSITY_TEST_ASSERT(!queue.empty());

            queue.clear();
            DENSITY_TEST_ASSERT(queue.empty());
            queue.clear();
        }
    }